

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O1

void __thiscall FileInputSource::setFilename(FileInputSource *this,char *filename)

{
  char *pcVar1;
  FILE *pFVar2;
  
  this->close_file = true;
  pcVar1 = (char *)(this->filename)._M_string_length;
  strlen(filename);
  std::__cxx11::string::_M_replace((ulong)&this->filename,0,pcVar1,(ulong)filename);
  pFVar2 = QUtil::safe_fopen(filename,"rb");
  this->file = pFVar2;
  return;
}

Assistant:

void
FileInputSource::setFilename(char const* filename)
{
    this->close_file = true;
    this->filename = filename;
    this->file = QUtil::safe_fopen(filename, "rb");
}